

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.c
# Opt level: O0

void yydestruct(char *yymsg,yysymbol_kind_t yykind,YYSTYPE *yyvaluep,void *yyscanner,
               compiler_state_t *cstate)

{
  compiler_state_t *cstate_local;
  void *yyscanner_local;
  YYSTYPE *yyvaluep_local;
  yysymbol_kind_t yykind_local;
  char *yymsg_local;
  
  return;
}

Assistant:

static void
yydestruct (const char *yymsg,
            yysymbol_kind_t yykind, YYSTYPE *yyvaluep, void *yyscanner, compiler_state_t *cstate)
{
  YY_USE (yyvaluep);
  YY_USE (yyscanner);
  YY_USE (cstate);
  if (!yymsg)
    yymsg = "Deleting";
  YY_SYMBOL_PRINT (yymsg, yykind, yyvaluep, yylocationp);

  YY_IGNORE_MAYBE_UNINITIALIZED_BEGIN
  YY_USE (yykind);
  YY_IGNORE_MAYBE_UNINITIALIZED_END
}